

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_buffers.c
# Opt level: O1

int av1_get_frame_buffer(void *cb_priv,size_t min_size,aom_codec_frame_buffer_t *fb)

{
  undefined8 *puVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  int *piVar5;
  int iVar6;
  
  iVar6 = -1;
  if (cb_priv != (void *)0x0) {
    uVar2 = *cb_priv;
    if ((int)uVar2 < 1) {
      uVar4 = 0;
    }
    else {
      piVar5 = (int *)(*(long *)((long)cb_priv + 8) + 0x10);
      uVar4 = 0;
      do {
        if (*piVar5 == 0) goto LAB_0039c144;
        uVar4 = uVar4 + 1;
        piVar5 = piVar5 + 6;
      } while (uVar2 != uVar4);
      uVar4 = (ulong)uVar2;
    }
LAB_0039c144:
    if ((uint)uVar4 != uVar2) {
      uVar4 = uVar4 & 0xffffffff;
      if (*(ulong *)(*(long *)((long)cb_priv + 8) + 8 + uVar4 * 0x18) < min_size) {
        aom_free(*(void **)(*(long *)((long)cb_priv + 8) + uVar4 * 0x18));
        pvVar3 = aom_calloc(1,min_size);
        puVar1 = (undefined8 *)(*(long *)((long)cb_priv + 8) + uVar4 * 0x18);
        *puVar1 = pvVar3;
        if (pvVar3 == (void *)0x0) {
          puVar1[1] = 0;
          return -1;
        }
        puVar1[1] = min_size;
      }
      puVar1 = (undefined8 *)(*(long *)((long)cb_priv + 8) + uVar4 * 0x18);
      fb->data = (uint8_t *)*puVar1;
      fb->size = puVar1[1];
      *(undefined4 *)(puVar1 + 2) = 1;
      fb->priv = puVar1;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int av1_get_frame_buffer(void *cb_priv, size_t min_size,
                         aom_codec_frame_buffer_t *fb) {
  int i;
  InternalFrameBufferList *const int_fb_list =
      (InternalFrameBufferList *)cb_priv;
  if (int_fb_list == NULL) return -1;

  // Find a free frame buffer.
  for (i = 0; i < int_fb_list->num_internal_frame_buffers; ++i) {
    if (!int_fb_list->int_fb[i].in_use) break;
  }

  if (i == int_fb_list->num_internal_frame_buffers) return -1;

  if (int_fb_list->int_fb[i].size < min_size) {
    aom_free(int_fb_list->int_fb[i].data);
    // The data must be zeroed to fix a valgrind error from the C loop filter
    // due to access uninitialized memory in frame border. It could be
    // skipped if border were totally removed.
    int_fb_list->int_fb[i].data = (uint8_t *)aom_calloc(1, min_size);
    if (!int_fb_list->int_fb[i].data) {
      int_fb_list->int_fb[i].size = 0;
      return -1;
    }
    int_fb_list->int_fb[i].size = min_size;
  }

  fb->data = int_fb_list->int_fb[i].data;
  fb->size = int_fb_list->int_fb[i].size;
  int_fb_list->int_fb[i].in_use = 1;

  // Set the frame buffer's private data to point at the internal frame buffer.
  fb->priv = &int_fb_list->int_fb[i];
  return 0;
}